

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

int GA_Assemble_duplicate(int g_a,char *array_name,void *ptr)

{
  global_array_t *pgVar1;
  int handle;
  char **ppcVar2;
  C_Integer *pCVar3;
  global_array_t *pgVar4;
  global_array_t *pgVar5;
  uint uVar6;
  int *piVar7;
  C_Integer *pCVar8;
  Integer IVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long *plVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  char err_string [256];
  int local_148;
  char local_138 [264];
  
  iVar14 = (int)GAnproc * 8;
  handle = g_a + 1000;
  uVar6 = calc_maplen(handle);
  pnga_sync();
  GAstat.numcre = GAstat.numcre + 1;
  if ((g_a < -1000) || (_max_global_array <= handle)) {
    sprintf(local_138,"%s: INVALID ARRAY HANDLE","ga_assemble_duplicate");
    pnga_error(local_138,(long)g_a);
  }
  if (GA[handle].actv == 0) {
    sprintf(local_138,"%s: ARRAY NOT ACTIVE","ga_assemble_duplicate");
    pnga_error(local_138,(long)g_a);
  }
  plVar13 = (long *)((long)ptr - (long)(iVar14 + 0x20));
  piVar7 = &GA->actv_handle;
  lVar11 = -1;
  do {
    iVar14 = *piVar7;
    lVar15 = lVar11 + 1;
    if (iVar14 == 0) break;
    lVar10 = lVar11 + 2;
    piVar7 = piVar7 + 0xda;
    lVar11 = lVar15;
  } while (lVar10 < _max_global_array);
  if (iVar14 == 0) {
    iVar14 = (int)lVar15;
    local_148 = iVar14 + -1000;
  }
  else {
    pnga_error("ga_assemble_duplicate: too many arrays ",(long)_max_global_array);
    local_148 = -0x3e9;
    iVar14 = -1;
    lVar15 = -1;
  }
  gai_init_struct(iVar14);
  pgVar5 = GA;
  pgVar1 = GA + lVar15;
  pgVar4 = GA + lVar15;
  GA[lVar15].actv_handle = 1;
  ppcVar2 = pgVar5[lVar15].ptr;
  memcpy(pgVar1,pgVar5 + handle,0x368);
  strcpy(pgVar4->name,array_name);
  GA[lVar15].ptr = ppcVar2;
  if (0 < (int)uVar6) {
    uVar16 = (ulong)uVar6;
    pCVar8 = (C_Integer *)malloc(uVar16 * 8 + 8);
    GA[lVar15].mapc = pCVar8;
    pCVar8 = GA[handle].mapc;
    pCVar3 = GA[lVar15].mapc;
    uVar12 = 0;
    do {
      pCVar3[uVar12] = pCVar8[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar16 != uVar12);
    pCVar3[uVar16] = -1;
  }
  IVar9 = pnga_type_f2c(plVar13[1]);
  if (999 < IVar9) {
    IVar9 = pnga_type_f2c(plVar13[1]);
    if (IVar9 < 0x4e8) {
      IVar9 = pnga_type_f2c(plVar13[1]);
      if (*(int *)(BYTE_ARRAY_001d22b1 + IVar9 * 0x10 + 0x2cf) != 0) goto LAB_0016858a;
    }
  }
  IVar9 = pnga_type_f2c(plVar13[1]);
  pnga_error("type not yet supported",IVar9);
LAB_0016858a:
  IVar9 = pnga_type_f2c(plVar13[1]);
  pgVar1 = GA;
  GA[lVar15].type = (int)IVar9;
  pgVar1[lVar15].size = plVar13[2];
  pgVar1[lVar15].id = *plVar13;
  memcpy(pgVar1[lVar15].ptr,plVar13 + 4,CONCAT44(GAnproc._4_4_,(int)GAnproc) << 3);
  GAstat.curmem = GAstat.curmem + GA[lVar15].size;
  lVar11 = GAstat.curmem;
  if (GAstat.curmem < GAstat.maxmem) {
    lVar11 = GAstat.maxmem;
  }
  GAstat.maxmem = lVar11;
  pnga_sync();
  return local_148;
}

Assistant:

int GA_Assemble_duplicate(int g_a, char* array_name, void* ptr)
{
char     **save_ptr;
int      i, ga_handle;
int extra = sizeof(getmem_t)+GAnproc*sizeof(char*);
getmem_t *info = (getmem_t *)((char*)ptr - extra);
char **ptr_arr = (char**)(info+1);
int g_b;
int maplen = calc_maplen(GA_OFFSET + g_a);


      pnga_sync();

      GAstat.numcre ++;

      ga_check_handleM(g_a,"ga_assemble_duplicate");

      /* find a free global_array handle for g_b */
      ga_handle =-1; i=0;
      do{
        if(!GA[i].actv_handle) ga_handle=i;
        i++;
      }while(i<_max_global_array && ga_handle==-1);
      if( ga_handle == -1)
          pnga_error("ga_assemble_duplicate: too many arrays ", 
                                           (Integer)_max_global_array);
      g_b = ga_handle - GA_OFFSET;

      gai_init_struct(ga_handle);
      GA[ga_handle].actv_handle = 1;

      /*** copy content of the data structure ***/
      save_ptr = GA[ga_handle].ptr;
      GA[ga_handle] = GA[GA_OFFSET + g_a];
      strcpy(GA[ga_handle].name, array_name);
      GA[ga_handle].ptr = save_ptr;
      if (maplen > 0) {
        GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
        for(i=0;i<maplen; i++)GA[ga_handle].mapc[i] = GA[GA_OFFSET+ g_a].mapc[i];
        GA[ga_handle].mapc[maplen] = -1;
      }

      /* get ptrs and datatype from user memory */
      gam_checktype(pnga_type_f2c(info->type));
      GA[ga_handle].type = pnga_type_f2c(info->type);
      GA[ga_handle].size = (C_Long)info->size;
      GA[ga_handle].id = info->id;
      memcpy(GA[ga_handle].ptr,ptr_arr,(size_t)GAnproc*sizeof(char**));

      GAstat.curmem += (long)GA[ga_handle].size;
      GAstat.maxmem  = (long)GA_MAX(GAstat.maxmem, GAstat.curmem);

      pnga_sync();

      return(g_b);
}